

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  bool bVar1;
  long *__s1;
  int iVar2;
  char *__s1_00;
  size_t sVar3;
  bool bVar4;
  string c;
  string local_88;
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,FLAGS_gtest_color_abi_cxx11_,
             DAT_004528c8 + FLAGS_gtest_color_abi_cxx11_);
  __s1 = local_68[0];
  if (local_68[0] != (long *)0x0) {
    iVar2 = strcasecmp((char *)local_68[0],"auto");
    if (iVar2 == 0) {
      __s1_00 = getenv("TERM");
      if (__s1_00 == (char *)0x0) {
        bVar1 = false;
        bVar4 = false;
      }
      else {
        iVar2 = strcmp(__s1_00,"xterm");
        bVar4 = true;
        if (iVar2 != 0) {
          iVar2 = strcmp(__s1_00,"xterm-color");
          if (iVar2 != 0) {
            iVar2 = strcmp(__s1_00,"xterm-kitty");
            if (iVar2 != 0) {
              iVar2 = strcmp(__s1_00,"alacritty");
              if (iVar2 != 0) {
                iVar2 = strcmp(__s1_00,"screen");
                if (iVar2 != 0) {
                  iVar2 = strcmp(__s1_00,"tmux");
                  if (iVar2 != 0) {
                    iVar2 = strcmp(__s1_00,"rxvt-unicode");
                    if (iVar2 != 0) {
                      iVar2 = strcmp(__s1_00,"linux");
                      if (iVar2 != 0) {
                        iVar2 = strcmp(__s1_00,"cygwin");
                        if (iVar2 != 0) {
                          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                          sVar3 = strlen(__s1_00);
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_88,__s1_00,__s1_00 + sVar3);
                          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_48,"-256color","");
                          bVar4 = String::EndsWithCaseInsensitive(&local_88,&local_48);
                          bVar1 = true;
                          goto LAB_00220f59;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        bVar1 = false;
      }
LAB_00220f59:
      if (bVar1) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      bVar4 = (bool)(bVar4 & stdout_is_tty);
      goto LAB_00220f96;
    }
    if (__s1 != (long *)0x0) {
      iVar2 = strcasecmp((char *)__s1,"yes");
      bVar4 = iVar2 == 0;
      if (__s1 != (long *)0x0 && !bVar4) {
        iVar2 = strcasecmp((char *)__s1,"true");
        bVar4 = iVar2 == 0;
        if (__s1 != (long *)0x0 && !bVar4) {
          iVar2 = strcasecmp((char *)__s1,"t");
          bVar4 = iVar2 == 0;
          if (__s1 != (long *)0x0 && !bVar4) {
            iVar2 = strcmp((char *)__s1,"1");
            bVar4 = iVar2 == 0;
          }
        }
      }
      goto LAB_00220f96;
    }
  }
  bVar4 = false;
LAB_00220f96:
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return bVar4;
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  std::string c = GTEST_FLAG_GET(color);
  const char* const gtest_color = c.c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if defined(GTEST_OS_WINDOWS) && !defined(GTEST_OS_WINDOWS_MINGW)
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        term != nullptr && (String::CStringEquals(term, "xterm") ||
                            String::CStringEquals(term, "xterm-color") ||
                            String::CStringEquals(term, "xterm-kitty") ||
                            String::CStringEquals(term, "alacritty") ||
                            String::CStringEquals(term, "screen") ||
                            String::CStringEquals(term, "tmux") ||
                            String::CStringEquals(term, "rxvt-unicode") ||
                            String::CStringEquals(term, "linux") ||
                            String::CStringEquals(term, "cygwin") ||
                            String::EndsWithCaseInsensitive(term, "-256color"));
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
         String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}